

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O1

double labpack_read_double_strict(labpack_reader_t *reader)

{
  mpack_error_t error;
  char *pcVar1;
  double dVar2;
  
  if (reader != (labpack_reader_t *)0x0) {
    dVar2 = 0.0;
    if (reader->status == LABPACK_STATUS_OK) {
      dVar2 = mpack_expect_double_strict(reader->decoder);
      error = reader->decoder->error;
      if (error != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        pcVar1 = labpack_mpack_error_message(error);
        reader->status_message = pcVar1;
      }
    }
    return dVar2;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x130,"double labpack_read_double_strict(labpack_reader_t *)");
}

Assistant:

double
labpack_read_double_strict(labpack_reader_t* reader)
{
    assert(reader);
    double value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_double_strict(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}